

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MemPool.cpp
# Opt level: O0

void amrex_mempool_finalize(void)

{
  (anonymous_namespace)::initialized = 0;
  std::
  vector<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>,_std::allocator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_>_>
  ::clear((vector<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>,_std::allocator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_>_>
           *)0x12edc74);
  return;
}

Assistant:

void amrex_mempool_finalize ()
{
    initialized = false;
    the_memory_pool.clear();
}